

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> * __thiscall
libtorrent::aux::session_impl::get_settings
          (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_>
           *__return_storage_ptr__,session_impl *this)

{
  bool val;
  int iVar1;
  string *psVar2;
  int local_54;
  int local_50;
  int i_2;
  int i_1;
  string local_40;
  int local_20;
  undefined1 local_19;
  int i;
  session_impl *this_local;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *ret;
  
  local_19 = 0;
  _i = this;
  this_local = (session_impl *)__return_storage_ptr__;
  settings_pack::settings_pack((settings_pack *)__return_storage_ptr__);
  for (local_20 = 0; iVar1 = local_20, local_20 < 0xd; local_20 = local_20 + 1) {
    psVar2 = session_settings::get_str_abi_cxx11_(&this->m_settings,local_20);
    ::std::__cxx11::string::string((string *)&local_40,(string *)psVar2);
    settings_pack::set_str((settings_pack *)__return_storage_ptr__,iVar1,&local_40);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  for (local_50 = 0x4000; local_50 < 0x409f; local_50 = local_50 + 1) {
    iVar1 = session_settings::get_int(&this->m_settings,local_50);
    settings_pack::set_int((settings_pack *)__return_storage_ptr__,local_50,iVar1);
  }
  for (local_54 = 0x8000; local_54 < 0x8054; local_54 = local_54 + 1) {
    val = session_settings::get_bool(&this->m_settings,local_54);
    settings_pack::set_bool((settings_pack *)__return_storage_ptr__,local_54,val);
  }
  return __return_storage_ptr__;
}

Assistant:

settings_pack session_impl::get_settings() const
	{
		settings_pack ret;
		// TODO: it would be nice to reserve() these vectors up front
		for (int i = settings_pack::string_type_base;
			i < settings_pack::max_string_setting_internal; ++i)
		{
			ret.set_str(i, m_settings.get_str(i));
		}
		for (int i = settings_pack::int_type_base;
			i < settings_pack::max_int_setting_internal; ++i)
		{
			ret.set_int(i, m_settings.get_int(i));
		}
		for (int i = settings_pack::bool_type_base;
			i < settings_pack::max_bool_setting_internal; ++i)
		{
			ret.set_bool(i, m_settings.get_bool(i));
		}
		return ret;
	}